

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo::InternalSerializeWithCachedSizesToArray
          (GeneratedCodeInfo *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  GeneratedCodeInfo_Annotation *this_00;
  uint8 *target_00;
  EpsCopyOutputStream *in_RDX;
  uint8 *in_RSI;
  EpsCopyOutputStream *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_ffffffffffffff58;
  uint local_90;
  uint8 *local_80;
  EpsCopyOutputStream *in_stack_ffffffffffffffb0;
  UnknownFieldSet *in_stack_ffffffffffffffb8;
  
  local_90 = 0;
  uVar1 = _internal_annotation_size((GeneratedCodeInfo *)0x53baf5);
  local_80 = in_RSI;
  for (; local_90 < uVar1; local_90 = local_90 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(in_RDI,in_stack_ffffffffffffff58);
    this_00 = _internal_annotation
                        ((GeneratedCodeInfo *)in_RDI,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20)
                        );
    in_stack_ffffffffffffffb0 = in_RDX;
    uVar2 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_80);
    uVar2 = GeneratedCodeInfo_Annotation::GetCachedSize((GeneratedCodeInfo_Annotation *)0x53bbb4);
    in_stack_ffffffffffffffb8 =
         (UnknownFieldSet *)io::CodedOutputStream::WriteVarint32ToArray(uVar2,target_00);
    local_80 = GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray
                         (this_00,(uint8 *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  if (((uint)in_RDI->buffer_end_ & 1) == 1) {
    in_RDI = (EpsCopyOutputStream *)&in_RDI->buffer_end_;
    if (((uint)*(uint8 **)in_RDI & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)in_RDI);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_80 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         (in_stack_ffffffffffffffb8,(uint8 *)in_stack_ffffffffffffffb0,in_RDI);
  }
  return local_80;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* GeneratedCodeInfo::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_annotation_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(1, this->_internal_annotation(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo)
  return target;
}